

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O1

Var Js::JavascriptObject::EntryGetOwnPropertyNames(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  RecyclableObject *pRVar6;
  JavascriptArray *pJVar7;
  int in_stack_00000010;
  Type local_48;
  Type TStack_40;
  undefined1 auStack_38 [8];
  ArgumentReader args;
  Var result;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x416,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cf1ee9;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_38 = (undefined1  [8])result;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_38,(CallInfo *)&result);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x419,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) {
LAB_00cf1ee9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  if (((ulong)auStack_38 & 0xfffffe) == 0) {
    pRVar6 = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  else {
    pRVar6 = (RecyclableObject *)Arguments::operator[]((Arguments *)auStack_38,1);
  }
  pRVar6 = JavascriptOperators::ToObject(pRVar6,pSVar1);
  if (((pRVar6->type).ptr)->typeId == TypeIds_HostDispatch) {
    local_48._0_4_ = auStack_38._0_4_;
    local_48._4_4_ = auStack_38._4_4_;
    TStack_40._0_4_ = args.super_Arguments.Info._0_4_;
    TStack_40._4_4_ = args.super_Arguments.Info._4_4_;
    iVar4 = (*(pRVar6->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x55])
                      (pRVar6,EntryGetOwnPropertyNames,&local_48,&args.super_Arguments.Values);
    if (iVar4 != 0) {
      return args.super_Arguments.Values;
    }
  }
  pJVar7 = JavascriptOperators::GetOwnPropertyNames(pRVar6,pSVar1);
  return pJVar7;
}

Assistant:

Var JavascriptObject::EntryGetOwnPropertyNames(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));
    CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Object_Constructor_getOwnPropertyNames);

    Var tempVar = args.Info.Count < 2 ? scriptContext->GetLibrary()->GetUndefined() : args[1];
    RecyclableObject *object = JavascriptOperators::ToObject(tempVar, scriptContext);

    if (object->GetTypeId() == TypeIds_HostDispatch)
    {
        Var result;
        if (object->InvokeBuiltInOperationRemotely(EntryGetOwnPropertyNames, args, &result))
        {
            return result;
        }
    }

    return JavascriptOperators::GetOwnPropertyNames(object, scriptContext);
}